

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)>::
UntypedPerformAction
          (FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<MockProblemBuilder::MutCommonExpr_&> *pAVar1;
  Action<MockProblemBuilder::MutCommonExpr_&(int)> action;
  linked_ptr<testing::ActionInterface<MockProblemBuilder::MutCommonExpr_&(int)>_> local_20;
  
  linked_ptr<testing::ActionInterface<MockProblemBuilder::MutCommonExpr&(int)>>::
  copy<testing::ActionInterface<MockProblemBuilder::MutCommonExpr&(int)>>
            ((linked_ptr<testing::ActionInterface<MockProblemBuilder::MutCommonExpr&(int)>> *)
             &local_20,
             (linked_ptr<testing::ActionInterface<MockProblemBuilder::MutCommonExpr_&(int)>_> *)
             untyped_action);
  pAVar1 = ActionResultHolder<MockProblemBuilder::MutCommonExpr&>::
           PerformAction<MockProblemBuilder::MutCommonExpr&(int)>
                     ((Action<MockProblemBuilder::MutCommonExpr_&(int)> *)&local_20,
                      (ArgumentTuple *)untyped_args);
  linked_ptr<testing::ActionInterface<MockProblemBuilder::MutCommonExpr_&(int)>_>::~linked_ptr
            (&local_20);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }